

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O1

bool pstore::gsl::operator<(span<int,__1L> *lhs,span<int,__1L> *rhs)

{
  bool bVar1;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_a8;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_98;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_88;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_78;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_68;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_58;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_48;
  span_iterator<pstore::gsl::span<int,__1L>,_false> local_38;
  
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator(&local_78,lhs,0);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_88,lhs,(lhs->storage_).super_extent_type<_1L>.size_);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator(&local_98,rhs,0);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_a8,rhs,(rhs->storage_).super_extent_type<_1L>.size_);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_38,local_78.span_,local_78.index_);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_48,local_88.span_,local_88.index_);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_58,local_98.span_,local_98.index_);
  details::span_iterator<pstore::gsl::span<int,_-1L>,_false>::span_iterator
            (&local_68,local_a8.span_,local_a8.index_);
  bVar1 = std::
          __lexicographical_compare_aux<pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>,pstore::gsl::details::span_iterator<pstore::gsl::span<int,_1l>,false>>
                    (&local_38,&local_48,&local_58,&local_68);
  return bVar1;
}

Assistant:

constexpr bool operator< (span<ElementType, Extent> const & lhs,
                                  span<ElementType, Extent> const & rhs) {
            return std::lexicographical_compare (lhs.begin (), lhs.end (), rhs.begin (),
                                                 rhs.end ());
        }